

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O2

string * getFilenameExt(string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  uVar1 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x3b518c);
  if (uVar1 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static const std::string getFilenameExt(const std::string filename) {
  // Extract file name extension
  std::string name = filename;
  std::size_t found = name.find_last_of(".");
  if (found < name.size()) {
    name = name.substr(found + 1);
  } else {
    name = "";
  }
  return name;
}